

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

float calculateNoise(Mat *inputImg)

{
  float fVar1;
  int iVar2;
  int y;
  int iVar3;
  double dVar4;
  float fVar5;
  
  iVar3 = *(int *)(inputImg + 8);
  iVar2 = *(int *)(inputImg + 0xc);
  if (iVar3 < 1) {
    fVar5 = 0.0;
  }
  else {
    fVar5 = 0.0;
    y = 0;
    do {
      if (0 < iVar2) {
        iVar3 = 0;
        do {
          dVar4 = getVariance(inputImg,y,iVar3);
          fVar1 = fVar5 + 1.0;
          if (dVar4 <= 450.0) {
            fVar1 = fVar5;
          }
          fVar5 = fVar1;
          iVar3 = iVar3 + 1;
          iVar2 = *(int *)(inputImg + 0xc);
        } while (iVar3 < iVar2);
        iVar3 = *(int *)(inputImg + 8);
      }
      y = y + 1;
    } while (y < iVar3);
  }
  return (fVar5 / (float)(iVar2 * iVar3)) * 100.0;
}

Assistant:

float calculateNoise(Mat inputImg) {
    float numOfNoisy = 0.0;
    for (int i = 0; i < inputImg.rows; i ++) {
        for (int j = 0; j < inputImg.cols; j++) {
            if ( getVariance(inputImg, i, j)  > 450) {
                numOfNoisy++;
            }
        }
    }
    return  ( numOfNoisy / (inputImg.rows * inputImg.cols) ) * 100;
}